

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O2

void __thiscall hello::csrf(hello *this)

{
  session_interface *this_00;
  bool bVar1;
  char cVar2;
  csrf c;
  string local_5f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  csrf local_5b0;
  
  this_00 = (session_interface *)cppcms::application::session();
  std::__cxx11::string::string((string *)&local_5b0,"name",(allocator *)&local_5d0);
  cppcms::session_interface::set<char[3]>(this_00,(string *)&local_5b0,(char (*) [3])0x12427e);
  std::__cxx11::string::~string((string *)&local_5b0);
  view::csrf::csrf(&local_5b0);
  cppcms::application::request();
  cppcms::http::request::request_method_abi_cxx11_((request *)&local_5d0);
  bVar1 = std::operator==(&local_5d0,"POST");
  std::__cxx11::string::~string((string *)&local_5d0);
  if (bVar1) {
    cppcms::application::context();
    cppcms::form::load((context *)&local_5b0.my_form);
    cVar2 = cppcms::form::validate();
    if (cVar2 != '\0') {
      local_5b0.valid = true;
    }
  }
  std::__cxx11::string::string(local_5f0,"csrf",(allocator *)&local_5d0);
  cppcms::application::render(this,local_5f0,&local_5b0);
  std::__cxx11::string::~string(local_5f0);
  view::csrf::~csrf(&local_5b0);
  return;
}

Assistant:

void csrf()
	{
		session().set("name","me");
		view::csrf c;
		if(request().request_method() == "POST") {
			c.my_form.load(context());
			if(c.my_form.validate()) {
				c.valid=true;
			}
		}
		render("csrf",c);
	}